

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000019a420 = 0x2e2e2e2e2e2e2e;
    uRam000000000019a427._0_1_ = '.';
    uRam000000000019a427._1_1_ = '.';
    uRam000000000019a427._2_1_ = '.';
    uRam000000000019a427._3_1_ = '.';
    uRam000000000019a427._4_1_ = '.';
    uRam000000000019a427._5_1_ = '.';
    uRam000000000019a427._6_1_ = '.';
    uRam000000000019a427._7_1_ = '.';
    DAT_0019a410 = '.';
    DAT_0019a410_1._0_1_ = '.';
    DAT_0019a410_1._1_1_ = '.';
    DAT_0019a410_1._2_1_ = '.';
    DAT_0019a410_1._3_1_ = '.';
    DAT_0019a410_1._4_1_ = '.';
    DAT_0019a410_1._5_1_ = '.';
    DAT_0019a410_1._6_1_ = '.';
    uRam000000000019a418 = 0x2e2e2e2e2e2e2e;
    DAT_0019a41f = 0x2e;
    DAT_0019a400 = '.';
    DAT_0019a400_1._0_1_ = '.';
    DAT_0019a400_1._1_1_ = '.';
    DAT_0019a400_1._2_1_ = '.';
    DAT_0019a400_1._3_1_ = '.';
    DAT_0019a400_1._4_1_ = '.';
    DAT_0019a400_1._5_1_ = '.';
    DAT_0019a400_1._6_1_ = '.';
    uRam000000000019a408._0_1_ = '.';
    uRam000000000019a408._1_1_ = '.';
    uRam000000000019a408._2_1_ = '.';
    uRam000000000019a408._3_1_ = '.';
    uRam000000000019a408._4_1_ = '.';
    uRam000000000019a408._5_1_ = '.';
    uRam000000000019a408._6_1_ = '.';
    uRam000000000019a408._7_1_ = '.';
    DAT_0019a3f0 = '.';
    DAT_0019a3f0_1._0_1_ = '.';
    DAT_0019a3f0_1._1_1_ = '.';
    DAT_0019a3f0_1._2_1_ = '.';
    DAT_0019a3f0_1._3_1_ = '.';
    DAT_0019a3f0_1._4_1_ = '.';
    DAT_0019a3f0_1._5_1_ = '.';
    DAT_0019a3f0_1._6_1_ = '.';
    uRam000000000019a3f8._0_1_ = '.';
    uRam000000000019a3f8._1_1_ = '.';
    uRam000000000019a3f8._2_1_ = '.';
    uRam000000000019a3f8._3_1_ = '.';
    uRam000000000019a3f8._4_1_ = '.';
    uRam000000000019a3f8._5_1_ = '.';
    uRam000000000019a3f8._6_1_ = '.';
    uRam000000000019a3f8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000019a3e8._0_1_ = '.';
    uRam000000000019a3e8._1_1_ = '.';
    uRam000000000019a3e8._2_1_ = '.';
    uRam000000000019a3e8._3_1_ = '.';
    uRam000000000019a3e8._4_1_ = '.';
    uRam000000000019a3e8._5_1_ = '.';
    uRam000000000019a3e8._6_1_ = '.';
    uRam000000000019a3e8._7_1_ = '.';
    DAT_0019a42f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}